

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkSets.c
# Opt level: O1

uint Lpk_ComputeSets(Kit_DsdNtk_t *p,Vec_Int_t *vSets)

{
  int *piVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  uint Entry;
  
  if (0x10 < p->nVars) {
    __assert_fail("p->nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkSets.c"
                  ,0x70,"unsigned int Lpk_ComputeSets(Kit_DsdNtk_t *, Vec_Int_t *)");
  }
  vSets->nSize = 0;
  Entry = 0;
  Vec_IntPush(vSets,0);
  uVar3 = (uint)(p->Root >> 1);
  uVar2 = (ulong)p->nVars;
  if (uVar3 < (uint)p->nNodes + (uint)p->nVars) {
    if (((uint)*p->pNodes[uVar3 - uVar2] & 0x1c0) != 0x40) {
      if (((uint)*p->pNodes[uVar3 - uVar2] & 0x1c0) == 0x80) {
        Entry = 1 << ((byte)((uint)p->pNodes[uVar3 - uVar2][1] >> 1) & 0x1f);
        Vec_IntPush(vSets,Entry);
      }
      else {
        Entry = Lpk_ComputeSets_rec(p,(uint)p->Root,vSets);
        if (0xffff < Entry) {
          __assert_fail("(uSupport & 0xFFFF0000) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkSets.c"
                        ,0x7c,"unsigned int Lpk_ComputeSets(Kit_DsdNtk_t *, Vec_Int_t *)");
        }
        Vec_IntPush(vSets,Entry);
        if (0 < vSets->nSize) {
          piVar1 = vSets->pArray;
          lVar4 = 0;
          do {
            uVar3 = piVar1[lVar4];
            piVar1[lVar4] = (~uVar3 & Entry) << 0x10 | uVar3;
            lVar4 = lVar4 + 1;
          } while (lVar4 < vSets->nSize);
        }
      }
    }
    return Entry;
  }
  __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kit.h"
                ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
}

Assistant:

unsigned Lpk_ComputeSets( Kit_DsdNtk_t * p, Vec_Int_t * vSets )
{
    unsigned uSupport, Entry;
    int Number, i;
    assert( p->nVars <= 16 );
    Vec_IntClear( vSets );
    Vec_IntPush( vSets, 0 );
    if ( Kit_DsdNtkRoot(p)->Type == KIT_DSD_CONST1 )
        return 0;
    if ( Kit_DsdNtkRoot(p)->Type == KIT_DSD_VAR )
    {
        uSupport = ( 1 << Abc_Lit2Var(Kit_DsdNtkRoot(p)->pFans[0]) );
        Vec_IntPush( vSets, uSupport );
        return uSupport;
    }
    uSupport = Lpk_ComputeSets_rec( p, p->Root, vSets );
    assert( (uSupport & 0xFFFF0000) == 0 );
    Vec_IntPush( vSets, uSupport );
    // set the remaining variables
    Vec_IntForEachEntry( vSets, Number, i )
    {
        Entry = Number;
        Vec_IntWriteEntry( vSets, i, Entry | ((uSupport & ~Entry) << 16) );
    }
    return uSupport;
}